

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg,ImGuiItemAddFlags flags)

{
  short *psVar1;
  ImGuiItemStatusFlags *pIVar2;
  ImRect *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImGuiNavLayer IVar7;
  ImGuiID IVar8;
  uint uVar9;
  ImGuiWindow *window;
  ImGuiWindow *pIVar10;
  ImVec2 IVar11;
  ImVec2 IVar12;
  ImGuiContext *pIVar13;
  bool bVar14;
  bool bVar15;
  ImGui *this;
  ImGuiNavItemData *result;
  ImGuiContext *g;
  ImVec2 IVar16;
  ImVec2 IVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  pIVar13 = GImGui;
  window = GImGui->CurrentWindow;
  if (id == 0) goto LAB_0014af82;
  IVar7 = (window->DC).NavLayerCurrent;
  psVar1 = &(window->DC).NavLayersActiveMaskNext;
  *psVar1 = *psVar1 | (ushort)(1 << ((byte)IVar7 & 0x1f));
  IVar8 = pIVar13->NavId;
  if ((((IVar8 != id) && (pIVar13->NavAnyRequest != true)) ||
      (pIVar10 = pIVar13->NavWindow, pIVar10->RootWindowForNav != window->RootWindowForNav)) ||
     ((window != pIVar10 && (((uint)(pIVar10->Flags | window->Flags) >> 0x17 & 1) == 0))))
  goto LAB_0014af82;
  if (nav_bb_arg == (ImRect *)0x0) {
    nav_bb_arg = bb;
  }
  uVar9 = pIVar13->CurrentItemFlags;
  result = (ImGuiNavItemData *)(ulong)uVar9;
  fVar22 = (window->Pos).x;
  fVar20 = (nav_bb_arg->Min).x - fVar22;
  fVar23 = (window->Pos).y;
  fVar21 = (nav_bb_arg->Min).y - fVar23;
  fVar22 = (nav_bb_arg->Max).x - fVar22;
  fVar23 = (nav_bb_arg->Max).y - fVar23;
  if ((pIVar13->NavInitRequest == true) && (pIVar13->NavLayer == IVar7)) {
    if ((uVar9 & 0x10) == 0) {
      pIVar13->NavInitResultId = id;
      IVar16.y = fVar21;
      IVar16.x = fVar20;
      IVar11.y = fVar23;
      IVar11.x = fVar22;
      (pIVar13->NavInitResultRectRel).Min = IVar16;
      (pIVar13->NavInitResultRectRel).Max = IVar11;
      pIVar13->NavInitRequest = false;
      if (pIVar13->NavMoveRequest == false) {
        pIVar13->NavAnyRequest = false;
      }
      else {
        pIVar13->NavAnyRequest = true;
      }
    }
    else if (pIVar13->NavInitResultId == 0) {
      pIVar13->NavInitResultId = id;
      IVar17.y = fVar21;
      IVar17.x = fVar20;
      IVar12.y = fVar23;
      IVar12.x = fVar22;
      (pIVar13->NavInitResultRectRel).Min = IVar17;
      (pIVar13->NavInitResultRectRel).Max = IVar12;
    }
  }
  if (IVar8 == id) {
    if (((byte)pIVar13->NavMoveRequestFlags >> 4 & (uVar9 & 0xc) == 0) != 0) {
LAB_0014b0d0:
      this = (ImGui *)&pIVar13->NavMoveResultOther;
      if (window == pIVar10) {
        this = (ImGui *)&pIVar13->NavMoveResultLocal;
      }
      if ((pIVar13->NavMoveRequest == true) &&
         (bVar14 = NavScoreItem(this,result,*nav_bb_arg), bVar14)) {
        *(ImGuiWindow **)this = window;
        *(ImGuiID *)(this + 8) = id;
        *(ImGuiID *)(this + 0xc) = (window->DC).NavFocusScopeIdCurrent;
        *(float *)(this + 0x10) = fVar20;
        *(float *)(this + 0x14) = fVar21;
        *(float *)(this + 0x18) = fVar22;
        *(float *)(this + 0x1c) = fVar23;
      }
      if ((pIVar13->NavMoveRequestFlags & 0x20) != 0) {
        fVar4 = (nav_bb_arg->Min).y;
        fVar18 = (window->ClipRect).Max.y;
        if (fVar4 < fVar18) {
          fVar5 = (nav_bb_arg->Max).y;
          fVar6 = (window->ClipRect).Min.y;
          if (((fVar6 < fVar5) &&
              (fVar19 = (window->ClipRect).Max.x,
              (nav_bb_arg->Min).x <= fVar19 && fVar19 != (nav_bb_arg->Min).x)) &&
             (fVar19 = (nav_bb_arg->Max).x,
             (window->ClipRect).Min.x <= fVar19 && fVar19 != (window->ClipRect).Min.x)) {
            fVar19 = fVar18;
            if (fVar5 <= fVar18) {
              fVar19 = fVar5;
            }
            if (fVar4 <= fVar18) {
              fVar18 = fVar4;
            }
            if (((fVar5 - fVar4) * 0.7 <=
                 (float)(-(uint)(fVar5 < fVar6) & (uint)fVar6 |
                        ~-(uint)(fVar5 < fVar6) & (uint)fVar19) -
                 (float)(-(uint)(fVar4 < fVar6) & (uint)fVar6 |
                        ~-(uint)(fVar4 < fVar6) & (uint)fVar18)) &&
               (bVar14 = NavScoreItem((ImGui *)&pIVar13->NavMoveResultLocalVisibleSet,result,
                                      *nav_bb_arg), bVar14)) {
              (pIVar13->NavMoveResultLocalVisibleSet).Window = window;
              (pIVar13->NavMoveResultLocalVisibleSet).ID = id;
              (pIVar13->NavMoveResultLocalVisibleSet).FocusScopeId =
                   (window->DC).NavFocusScopeIdCurrent;
              (pIVar13->NavMoveResultLocalVisibleSet).RectRel.Min.x = fVar20;
              (pIVar13->NavMoveResultLocalVisibleSet).RectRel.Min.y = fVar21;
              (pIVar13->NavMoveResultLocalVisibleSet).RectRel.Max.x = fVar22;
              (pIVar13->NavMoveResultLocalVisibleSet).RectRel.Max.y = fVar23;
            }
          }
        }
      }
    }
  }
  else if ((uVar9 & 0xc) == 0) goto LAB_0014b0d0;
  if (pIVar13->NavId == id) {
    pIVar13->NavWindow = window;
    IVar7 = (window->DC).NavLayerCurrent;
    pIVar13->NavLayer = IVar7;
    pIVar13->NavFocusScopeId = (window->DC).NavFocusScopeIdCurrent;
    pIVar13->NavIdIsAlive = true;
    pIVar3 = window->NavRectRel + IVar7;
    (pIVar3->Min).x = fVar20;
    (pIVar3->Min).y = fVar21;
    (pIVar3->Max).x = fVar22;
    (pIVar3->Max).y = fVar23;
  }
LAB_0014af82:
  (window->DC).LastItemId = id;
  IVar12 = bb->Max;
  (window->DC).LastItemRect.Min = bb->Min;
  (window->DC).LastItemRect.Max = IVar12;
  (window->DC).LastItemStatusFlags = 0;
  (pIVar13->NextItemData).Flags = 0;
  bVar14 = IsClippedEx(bb,id,false);
  if (!bVar14) {
    if ((flags & 1U) != 0) {
      ItemFocusable(window,id);
    }
    bVar15 = IsMouseHoveringRect(&bb->Min,&bb->Max,true);
    if (bVar15) {
      pIVar2 = &(window->DC).LastItemStatusFlags;
      *(byte *)pIVar2 = (byte)*pIVar2 | 1;
    }
  }
  return !bVar14;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg, ImGuiItemAddFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (id != 0)
    {
        // Navigation processing runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests
        //      unfortunately, but it is still limited to one window. It may not scale very well for windows with ten of
        //      thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able
        //      to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick).
        // We intentionally don't check if g.NavWindow != NULL because g.NavAnyRequest should only be set when it is non null.
        // If we crash on a NULL g.NavWindow we need to fix the bug elsewhere.
        window->DC.NavLayersActiveMaskNext |= (1 << window->DC.NavLayerCurrent);
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem(window, nav_bb_arg ? *nav_bb_arg : bb, id);

        // [DEBUG] Item Picker tool, when enabling the "extended" version we perform the check in ItemAdd()
#ifdef IMGUI_DEBUG_TOOL_ITEM_PICKER_EX
        if (id == g.DebugItemPickerBreakId)
        {
            IM_DEBUG_BREAK();
            g.DebugItemPickerBreakId = 0;
        }
#endif
    }

    // Equivalent to calling SetLastItemData()
    window->DC.LastItemId = id;
    window->DC.LastItemRect = bb;
    window->DC.LastItemStatusFlags = ImGuiItemStatusFlags_None;
    g.NextItemData.Flags = ImGuiNextItemDataFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id, false);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // Tab stop handling (previously was using internal ItemFocusable() api)
    // FIXME-NAV: We would now want to move this above the clipping test, but this would require being able to scroll and currently this would mean an extra frame. (#4079, #343)
    if (flags & ImGuiItemAddFlags_Focusable)
        ItemFocusable(window, id);

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}